

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O3

void __thiscall Am_Inter_Location_Data::Print(Am_Inter_Location_Data *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  if (this->as_line == true) {
    poVar2 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.top);
    pcVar4 = ").(";
    lVar3 = 3;
  }
  else {
    bVar1 = this->growing;
    poVar2 = (ostream *)std::ostream::operator<<(os,(this->data).rect.left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.top);
    if (bVar1 != true) goto LAB_001b5ca1;
    pcVar4 = ",";
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).rect.height);
LAB_001b5ca1:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(os," w.r.t. ",8);
  ::operator<<(os,&this->ref_obj);
  return;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}